

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::GetInlineCacheFromFuncObjectForRuntimeUse
          (Lowerer *this,Instr *instr,PropertySymOpnd *propSymOpnd,bool isHelper)

{
  RegOpnd *dst;
  bool bVar1;
  uint32 uVar2;
  LabelInstr *pLVar3;
  IndirOpnd *pIVar4;
  RegOpnd *pRVar5;
  IntConstOpnd *src;
  AddrOpnd *src_00;
  Instr *pIVar6;
  Instr *ldCacheFromPropSymOpndInstr;
  LabelInstr *continueLabel;
  RegOpnd *pRStack_60;
  int inlineCacheOffset;
  RegOpnd *indexOpnd;
  RegOpnd *inlineCacheOpnd;
  RegOpnd *inlineCachesOpnd;
  LabelInstr *inlineCachesNullLabel;
  RegOpnd *funcObjHasInlineCachesOpnd;
  Instr *funcObjInstr;
  RegOpnd *funcObjOpnd;
  byte indirScale;
  PropertySymOpnd *pPStack_20;
  bool isHelper_local;
  PropertySymOpnd *propSymOpnd_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  funcObjOpnd._7_1_ = isHelper;
  pPStack_20 = propSymOpnd;
  propSymOpnd_local = (PropertySymOpnd *)instr;
  instr_local = (Instr *)this;
  funcObjOpnd._6_1_ = LowererMD::GetDefaultIndirScale();
  funcObjInstr = (Instr *)IR::RegOpnd::New(TyUint64,this->m_func);
  funcObjHasInlineCachesOpnd =
       (RegOpnd *)
       IR::Instr::New(Ld_A,(Opnd *)funcObjInstr,*(Func **)&propSymOpnd_local->m_inlineCacheIndex);
  IR::Instr::InsertBefore((Instr *)propSymOpnd_local,(Instr *)funcObjHasInlineCachesOpnd);
  LoadFuncExpression(this,(Instr *)funcObjHasInlineCachesOpnd);
  pLVar3 = (LabelInstr *)IR::RegOpnd::New(TyUint64,*(Func **)&propSymOpnd_local->m_inlineCacheIndex)
  ;
  pIVar6 = funcObjInstr;
  inlineCachesNullLabel = pLVar3;
  uVar2 = Js::ScriptFunction::GetOffsetOfHasInlineCaches();
  pIVar4 = IR::IndirOpnd::New((RegOpnd *)pIVar6,uVar2,TyUint8,
                              *(Func **)&propSymOpnd_local->m_inlineCacheIndex,false);
  InsertMove((Opnd *)pLVar3,&pIVar4->super_Opnd,(Instr *)propSymOpnd_local,true);
  inlineCachesOpnd =
       (RegOpnd *)
       IR::LabelInstr::New(Label,*(Func **)&propSymOpnd_local->m_inlineCacheIndex,
                           (bool)(funcObjOpnd._7_1_ & 1));
  InsertTestBranch((Opnd *)inlineCachesNullLabel,(Opnd *)inlineCachesNullLabel,BrEq_A,
                   (LabelInstr *)inlineCachesOpnd,(Instr *)propSymOpnd_local);
  pRVar5 = IR::RegOpnd::New(TyUint64,*(Func **)&propSymOpnd_local->m_inlineCacheIndex);
  pIVar6 = funcObjInstr;
  inlineCacheOpnd = pRVar5;
  uVar2 = Js::ScriptFunctionWithInlineCache::GetOffsetOfInlineCaches();
  pIVar4 = IR::IndirOpnd::New((RegOpnd *)pIVar6,uVar2,TyUint64,
                              *(Func **)&propSymOpnd_local->m_inlineCacheIndex,false);
  InsertMove(&pRVar5->super_Opnd,&pIVar4->super_Opnd,(Instr *)propSymOpnd_local,true);
  indexOpnd = IR::RegOpnd::New(TyUint64,*(Func **)&propSymOpnd_local->m_inlineCacheIndex);
  pRStack_60 = IR::RegOpnd::New(TyInt64,*(Func **)&propSymOpnd_local->m_inlineCacheIndex);
  bVar1 = Int32Math::Mul(8,pPStack_20->m_inlineCacheIndex,(int32 *)((long)&continueLabel + 4));
  dst = indexOpnd;
  pRVar5 = pRStack_60;
  if (bVar1) {
    src = IR::IntConstOpnd::New
                    ((ulong)pPStack_20->m_inlineCacheIndex,TyUint32,
                     *(Func **)&propSymOpnd_local->m_inlineCacheIndex,false);
    InsertMove(&pRVar5->super_Opnd,&src->super_Opnd,(Instr *)propSymOpnd_local,true);
    pRVar5 = indexOpnd;
    pIVar4 = IR::IndirOpnd::New(inlineCacheOpnd,pRStack_60,funcObjOpnd._6_1_,TyUint64,
                                *(Func **)&propSymOpnd_local->m_inlineCacheIndex);
    InsertMove(&pRVar5->super_Opnd,&pIVar4->super_Opnd,(Instr *)propSymOpnd_local,true);
  }
  else {
    pIVar4 = IR::IndirOpnd::New(inlineCacheOpnd,continueLabel._4_4_,TyUint64,
                                *(Func **)&propSymOpnd_local->m_inlineCacheIndex,false);
    InsertMove(&dst->super_Opnd,&pIVar4->super_Opnd,(Instr *)propSymOpnd_local,true);
  }
  pLVar3 = IR::LabelInstr::New(Label,*(Func **)&propSymOpnd_local->m_inlineCacheIndex,
                               (bool)(funcObjOpnd._7_1_ & 1));
  InsertBranch(JMP,pLVar3,(Instr *)propSymOpnd_local);
  pRVar5 = indexOpnd;
  src_00 = IR::AddrOpnd::New(pPStack_20->m_runtimeInlineCache,AddrOpndKindDynamicInlineCache,
                             this->m_func,false,(Var)0x0);
  pIVar6 = InsertMove(&pRVar5->super_Opnd,&src_00->super_Opnd,(Instr *)propSymOpnd_local,true);
  IR::Instr::InsertBefore(pIVar6,(Instr *)inlineCachesOpnd);
  IR::Instr::InsertAfter(pIVar6,&pLVar3->super_Instr);
  return &indexOpnd->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GetInlineCacheFromFuncObjectForRuntimeUse(IR::Instr * instr, IR::PropertySymOpnd * propSymOpnd, bool isHelper)
{
    // MOV s1, [ebp + 8]                        //s1 = function object
    // MOV s2, [s1 + offset(hasInlineCaches)]
    // TEST s2, s2
    // JE $L1
    // MOV s3, [s1 + offset(m_inlineCaches)]    //s3 = inlineCaches from function object
    // MOV s4, [s3 + index*scale]               //s4 = inlineCaches[index]
    // JMP $L2
    // $L1
    // MOV s3, propSym->m_runtimeCache
    // $L2

    byte indirScale = this->m_lowererMD.GetDefaultIndirScale();

    IR::RegOpnd * funcObjOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    IR::Instr * funcObjInstr = IR::Instr::New(Js::OpCode::Ld_A, funcObjOpnd, instr->m_func);
    instr->InsertBefore(funcObjInstr);
    LoadFuncExpression(funcObjInstr);

    IR::RegOpnd * funcObjHasInlineCachesOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
    this->InsertMove(funcObjHasInlineCachesOpnd, IR::IndirOpnd::New(funcObjOpnd, Js::ScriptFunction::GetOffsetOfHasInlineCaches(), TyUint8, instr->m_func), instr);

    IR::LabelInstr * inlineCachesNullLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, isHelper);
    InsertTestBranch(funcObjHasInlineCachesOpnd, funcObjHasInlineCachesOpnd, Js::OpCode::BrEq_A, inlineCachesNullLabel, instr);

    IR::RegOpnd * inlineCachesOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
    Lowerer::InsertMove(inlineCachesOpnd, IR::IndirOpnd::New(funcObjOpnd, Js::ScriptFunctionWithInlineCache::GetOffsetOfInlineCaches(), TyMachPtr, instr->m_func), instr);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
    IR::RegOpnd * indexOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
    int inlineCacheOffset;
    if (!Int32Math::Mul(sizeof(Js::InlineCache *), propSymOpnd->m_inlineCacheIndex, &inlineCacheOffset))
    {
        Lowerer::InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(inlineCachesOpnd, inlineCacheOffset, TyMachPtr, instr->m_func), instr);
    }
    else
    {
        Lowerer::InsertMove(indexOpnd, IR::IntConstOpnd::New(propSymOpnd->m_inlineCacheIndex, TyUint32, instr->m_func), instr);
        Lowerer::InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(inlineCachesOpnd, indexOpnd, indirScale, TyMachPtr, instr->m_func), instr);
    }

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, isHelper);
    InsertBranch(LowererMD::MDUncondBranchOpcode, continueLabel, instr);

    IR::Instr * ldCacheFromPropSymOpndInstr = this->InsertMove(inlineCacheOpnd, IR::AddrOpnd::New(propSymOpnd->m_runtimeInlineCache, IR::AddrOpndKindDynamicInlineCache, this->m_func), instr);
    ldCacheFromPropSymOpndInstr->InsertBefore(inlineCachesNullLabel);

    ldCacheFromPropSymOpndInstr->InsertAfter(continueLabel);

    return inlineCacheOpnd;
}